

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexMainWriter::storeConstValue
          (PtexMainWriter *this,int faceid,void *data,int stride,Res res)

{
  int iVar1;
  pointer dst;
  
  dst = (this->_constdata).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start +
        (long)faceid * (long)(this->super_PtexWriterBase)._pixelSize;
  PtexUtils::average(data,stride,1 << (res.ulog2 & 0x1fU),1 << (res.vlog2 & 0x1fU),dst,
                     (this->super_PtexWriterBase)._header.datatype,
                     (uint)(this->super_PtexWriterBase)._header.nchannels);
  iVar1 = (this->super_PtexWriterBase)._header.alphachan;
  if ((-1 < iVar1) && (iVar1 < (int)(uint)(this->super_PtexWriterBase)._header.nchannels)) {
    PtexUtils::divalpha(dst,1,(this->super_PtexWriterBase)._header.datatype,
                        (uint)(this->super_PtexWriterBase)._header.nchannels,
                        (this->super_PtexWriterBase)._header.alphachan);
    return;
  }
  return;
}

Assistant:

void PtexMainWriter::storeConstValue(int faceid, const void* data, int stride, Res res)
{
    // compute average value and store in _constdata block
    uint8_t* constdata = &_constdata[faceid*_pixelSize];
    PtexUtils::average(data, stride, res.u(), res.v(), constdata,
                       datatype(), _header.nchannels);
    if (_header.hasAlpha())
        PtexUtils::divalpha(constdata, 1, datatype(), _header.nchannels, _header.alphachan);
}